

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O1

void try_merge(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,MB_MODE_INFO **mib,
              TokenExtra **tp,int mi_row,int mi_col,BLOCK_SIZE bsize,PC_TREE *pc_tree,
              PARTITION_TYPE partition,BLOCK_SIZE subsize,int pl)

{
  int iVar1;
  PC_TREE *pPVar2;
  bool bVar3;
  BLOCK_SIZE BVar4;
  int x;
  uint uVar5;
  uint uVar6;
  PICK_MODE_CONTEXT *pPVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  int i;
  ulong uVar11;
  uint mi_row_00;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  bool bVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  undefined4 in_stack_fffffffffffffda8;
  RD_STATS block_rdc;
  RD_STATS none_rdc;
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  
  bVar18 = ((cpi->common).seq_params)->monochrome == '\0';
  iVar16 = bVar18 + 1 + (uint)bVar18;
  uVar6 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
  none_rdc.rate = 0x7fffffff;
  none_rdc.zero_rate = 0;
  none_rdc.dist = 0x7fffffffffffffff;
  none_rdc.rdcost = 0x7fffffffffffffff;
  none_rdc.sse = 0x7fffffffffffffff;
  none_rdc.skip_txfm = '\0';
  av1_save_context(&td->mb,&x_ctx,mi_row,mi_col,bsize,iVar16);
  (td->mb).e_mbd.above_txfm_context =
       (cpi->common).above_contexts.txfm[(tile_data->tile_info).tile_row] + mi_col;
  (td->mb).e_mbd.left_txfm_context = (td->mb).e_mbd.left_txfm_context_buffer + (mi_row & 0x1f);
  pc_tree->partitioning = '\0';
  if (pc_tree->none == (PICK_MODE_CONTEXT *)0x0) {
    pPVar7 = av1_alloc_pmc(cpi,bsize,&td->shared_coeff_buf);
    pc_tree->none = pPVar7;
    if (pPVar7 == (PICK_MODE_CONTEXT *)0x0) {
      aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
    }
  }
  else {
    av1_reset_pmc(pc_tree->none);
  }
  uVar6 = uVar6 >> 1;
  pick_sb_modes_nonrd(cpi,tile_data,&td->mb,mi_row,mi_col,&none_rdc,bsize,pc_tree->none);
  lVar9 = (long)none_rdc.rate + (long)(td->mb).mode_costs.partition_cost[pl][0];
  none_rdc.rate = (int)lVar9;
  none_rdc.rdcost = none_rdc.dist * 0x80 + ((td->mb).rdmult * lVar9 + 0x100 >> 9);
  av1_restore_context(&td->mb,&x_ctx,mi_row,mi_col,bsize,iVar16);
  iVar8 = (cpi->sf).rt_sf.nonrd_check_partition_merge_mode;
  if ((none_rdc.skip_txfm == '\x01' && 1 < iVar8) && ((pc_tree->none->mic).mode != '\x10')) {
    bVar3 = false;
    lVar9 = 0x7fffffffffffffff;
  }
  else {
    iVar13 = (cpi->common).quant_params.base_qindex;
    bVar18 = (bsize < BLOCK_32X64 || iVar8 != 3) || bsize < BLOCK_64X128 && 100 < iVar13;
    bVar3 = bVar18;
    if ((1 < iVar8) &&
       (((((cpi->oxcf).tune_cfg.content != AOM_CONTENT_SCREEN &&
          (uVar10 = (*(ushort *)&(*(td->mb).e_mbd.mi)->field_0xa7 & 7) - 1,
          none_rdc.skip_txfm != '\0' && 1 < uVar10)) && (bVar3 = false, BLOCK_32X16 < bsize)) &&
        ((cpi->oxcf).rc_cfg.mode == AOM_CBR)))) {
      if ((iVar13 == 0 || uVar10 < 2) || ((cpi->oxcf).use_highbitdepth != false || iVar13 < 0x65)) {
        bVar3 = false;
      }
      else {
        bVar3 = bVar18;
        if ((bsize == BLOCK_32X32 && (pc_tree->none->mic).mode == '\x10') &&
            ((bsize < BLOCK_32X64 || iVar8 != 3) || bsize < BLOCK_64X128 && 100 < iVar13)) {
          BVar4 = get_partition_subsize(bsize,partition);
          uVar11 = 0;
          dVar20 = 1.79769313486232e+308;
          dVar22 = 0.0;
          uVar10 = uVar6;
          do {
            iVar8 = (int)uVar11;
            uVar17 = 0;
            if ((uVar11 & 1) != 0) {
              uVar17 = uVar6;
            }
            iVar13 = (int)(uVar11 >> 1) * uVar6;
            if ((iVar13 + mi_row < (cpi->common).mi_params.mi_rows) &&
               ((int)(mi_col + uVar17) < (cpi->common).mi_params.mi_cols)) {
              iVar1 = (td->mb).plane[0].src.stride;
              uVar11 = (ulong)(uint)(iVar13 * 4);
              iVar13 = (td->mb).e_mbd.plane[0].dst.stride;
              uVar6 = (*cpi->ppi->fn_ptr[BVar4].vf)
                                ((td->mb).plane[0].src.buf +
                                 (ulong)(uVar17 << 2) + (long)iVar1 * uVar11,iVar1,
                                 (td->mb).e_mbd.plane[0].dst.buf +
                                 (ulong)(uVar17 << 2) + (long)iVar13 * uVar11,iVar13,
                                 (uint *)&block_rdc);
              dVar19 = ((double)uVar6 / (double)block_size_wide[BVar4]) /
                       (double)block_size_high[BVar4];
              if (dVar19 < 0.0) {
                dVar19 = sqrt(dVar19);
                uVar6 = uVar10;
              }
              else {
                dVar19 = SQRT(dVar19);
                uVar6 = uVar10;
              }
              dVar21 = dVar19;
              if (dVar20 <= dVar19) {
                dVar21 = dVar20;
              }
              if (dVar19 <= dVar22) {
                dVar19 = dVar22;
              }
              bVar3 = true;
              dVar20 = dVar21;
              dVar22 = dVar19;
              uVar10 = uVar6;
            }
            else {
              bVar3 = false;
            }
            if (!bVar3) goto LAB_001eb824;
            uVar11 = (ulong)(iVar8 + 1U);
          } while (iVar8 + 1U != 4);
          iVar8 = 4;
LAB_001eb824:
          uVar6 = uVar10;
          bVar3 = (1.5 < dVar22 - dVar20 || iVar8 != 4) && bVar18;
        }
      }
    }
    lVar9 = 0x7fffffffffffffff;
    if (bVar3) {
      uVar10 = (td->mb).mode_costs.partition_cost[pl][3];
      uVar11 = 0;
      lVar14 = 0;
      lVar9 = 0;
      uVar17 = uVar6;
      do {
        block_rdc.rate = 0x7fffffff;
        block_rdc.zero_rate = 0;
        block_rdc.dist = 0x7fffffffffffffff;
        block_rdc.rdcost = 0x7fffffffffffffff;
        block_rdc.sse = 0x7fffffffffffffff;
        uVar5 = 0;
        if ((uVar11 & 1) != 0) {
          uVar5 = uVar6;
        }
        block_rdc.skip_txfm = '\0';
        mi_row_00 = ((uint)(uVar11 >> 1) & 0x7fffffff) * uVar6 + mi_row;
        bVar18 = false;
        lVar12 = lVar9;
        if (((int)mi_row_00 < (cpi->common).mi_params.mi_rows) &&
           (iVar8 = mi_col + uVar5, iVar8 < (cpi->common).mi_params.mi_cols)) {
          (td->mb).e_mbd.above_txfm_context =
               (cpi->common).above_contexts.txfm[(tile_data->tile_info).tile_row] +
               (ulong)uVar5 + (long)mi_col;
          (td->mb).e_mbd.left_txfm_context =
               (td->mb).e_mbd.left_txfm_context_buffer + (mi_row_00 & 0x1f);
          pPVar7 = pc_tree->split[uVar11]->none;
          if (pPVar7 == (PICK_MODE_CONTEXT *)0x0) {
            pPVar7 = av1_alloc_pmc(cpi,subsize,&td->shared_coeff_buf);
            pc_tree->split[uVar11]->none = pPVar7;
            uVar6 = uVar17;
            if (pc_tree->split[uVar11]->none == (PICK_MODE_CONTEXT *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate PICK_MODE_CONTEXT");
              uVar6 = uVar17;
            }
          }
          else {
            av1_reset_pmc(pPVar7);
            uVar6 = uVar17;
          }
          pPVar2 = pc_tree->split[uVar11];
          pPVar2->partitioning = '\0';
          pick_sb_modes_nonrd(cpi,tile_data,&td->mb,mi_row_00,iVar8,&block_rdc,subsize,pPVar2->none)
          ;
          uVar17 = uVar10 + block_rdc.rate;
          uVar10 = 0x7fffffff;
          if (uVar17 == 0x7fffffff) {
            lVar12 = 0x7fffffffffffffff;
            lVar14 = 0x7fffffffffffffff;
          }
          else {
            lVar15 = lVar14 + block_rdc.dist;
            lVar12 = 0x7fffffffffffffff;
            if (lVar15 == 0x7fffffffffffffff) {
              lVar14 = 0x7fffffffffffffff;
            }
            else {
              lVar12 = 0x7fffffffffffffff;
              lVar14 = 0x7fffffffffffffff;
              if (lVar9 != 0x7fffffffffffffff) {
                lVar9 = (long)(td->mb).rdmult;
                lVar14 = lVar15;
                uVar10 = uVar17;
                if ((int)uVar17 < 0) {
                  lVar12 = lVar15 * 0x80 - ((long)(lVar9 * (ulong)-uVar17 + 0x100) >> 9);
                }
                else {
                  lVar12 = lVar15 * 0x80 + ((long)(lVar9 * (ulong)uVar17 + 0x100) >> 9);
                }
              }
            }
          }
          bVar18 = true;
          uVar17 = uVar6;
          if ((lVar12 <= none_rdc.rdcost) && (bVar18 = false, uVar11 != 3)) {
            encode_b_nonrd(cpi,tile_data,td,tp,mi_row_00,iVar8,'\x01',subsize,'\0',
                           pc_tree->split[uVar11]->none,
                           (int *)CONCAT44(uVar6,in_stack_fffffffffffffda8));
            uVar17 = uVar6;
          }
        }
      } while ((!bVar18) && (uVar11 = uVar11 + 1, lVar9 = lVar12, uVar11 != 4));
      av1_restore_context(&td->mb,&x_ctx,mi_row,mi_col,bsize,iVar16);
      lVar9 = lVar14 * 0x80 + ((long)(td->mb).rdmult * (long)(int)uVar10 + 0x100 >> 9);
      uVar6 = uVar17;
    }
    else {
      bVar3 = false;
    }
  }
  if (none_rdc.rdcost < lVar9) {
    if (bVar3) {
      (td->mb).reuse_inter_pred = false;
    }
    (*mib)->bsize = bsize;
    pc_tree->partitioning = '\0';
    encode_b_nonrd(cpi,tile_data,td,tp,mi_row,mi_col,'\0',bsize,partition,pc_tree->none,
                   (int *)CONCAT44(uVar6,in_stack_fffffffffffffda8));
  }
  else {
    (*mib)->bsize = subsize;
    pc_tree->partitioning = '\x03';
    (td->mb).reuse_inter_pred = false;
    uVar11 = 0;
    uVar10 = uVar6;
    do {
      iVar16 = ((uint)(uVar11 >> 1) & 0x7fffffff) * uVar6 + mi_row;
      if (iVar16 < (cpi->common).mi_params.mi_rows) {
        uVar17 = 0;
        if ((uVar11 & 1) != 0) {
          uVar17 = uVar6;
        }
        if ((int)(uVar17 + mi_col) < (cpi->common).mi_params.mi_cols) {
          uVar6 = uVar10;
          if (pc_tree->split[uVar11]->none == (PICK_MODE_CONTEXT *)0x0) {
            pPVar7 = av1_alloc_pmc(cpi,subsize,&td->shared_coeff_buf);
            pc_tree->split[uVar11]->none = pPVar7;
            uVar6 = uVar10;
            if (pc_tree->split[uVar11]->none == (PICK_MODE_CONTEXT *)0x0) {
              aom_internal_error((td->mb).e_mbd.error_info,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate PICK_MODE_CONTEXT");
              uVar6 = uVar10;
            }
          }
          encode_b_nonrd(cpi,tile_data,td,tp,iVar16,uVar17 + mi_col,'\0',subsize,'\0',
                         pc_tree->split[uVar11]->none,
                         (int *)CONCAT44(uVar6,in_stack_fffffffffffffda8));
          uVar10 = uVar6;
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != 4);
  }
  return;
}

Assistant:

static void try_merge(AV1_COMP *const cpi, ThreadData *td,
                      TileDataEnc *tile_data, MB_MODE_INFO **mib,
                      TokenExtra **tp, const int mi_row, const int mi_col,
                      const BLOCK_SIZE bsize, PC_TREE *const pc_tree,
                      const PARTITION_TYPE partition, const BLOCK_SIZE subsize,
                      const int pl) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  TileInfo *const tile_info = &tile_data->tile_info;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int num_planes = av1_num_planes(cm);
  // Only square blocks from 8x8 to 128x128 are supported
  assert(bsize >= BLOCK_8X8 && bsize <= BLOCK_128X128);
  const int bs = mi_size_wide[bsize];
  const int hbs = bs / 2;
  bool do_split = false;
  RD_SEARCH_MACROBLOCK_CONTEXT x_ctx;
  RD_STATS split_rdc, none_rdc;
  av1_invalid_rd_stats(&split_rdc);
  av1_invalid_rd_stats(&none_rdc);
  av1_save_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
  xd->above_txfm_context =
      cm->above_contexts.txfm[tile_info->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);
  pc_tree->partitioning = PARTITION_NONE;
  if (!pc_tree->none) {
    pc_tree->none = av1_alloc_pmc(cpi, bsize, &td->shared_coeff_buf);
    if (!pc_tree->none)
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
  } else {
    av1_reset_pmc(pc_tree->none);
  }
  pick_sb_modes_nonrd(cpi, tile_data, x, mi_row, mi_col, &none_rdc, bsize,
                      pc_tree->none);
  none_rdc.rate += mode_costs->partition_cost[pl][PARTITION_NONE];
  none_rdc.rdcost = RDCOST(x->rdmult, none_rdc.rate, none_rdc.dist);
  av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);

  if (cpi->sf.rt_sf.nonrd_check_partition_merge_mode < 2 ||
      none_rdc.skip_txfm != 1 || pc_tree->none->mic.mode == NEWMV) {
    do_split = calc_do_split_flag(cpi, x, pc_tree, &none_rdc, mi_params, mi_row,
                                  mi_col, hbs, bsize, partition);
    if (do_split) {
      av1_init_rd_stats(&split_rdc);
      split_rdc.rate += mode_costs->partition_cost[pl][PARTITION_SPLIT];
      for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
        RD_STATS block_rdc;
        av1_invalid_rd_stats(&block_rdc);
        int x_idx = (i & 1) * hbs;
        int y_idx = (i >> 1) * hbs;
        if ((mi_row + y_idx >= mi_params->mi_rows) ||
            (mi_col + x_idx >= mi_params->mi_cols))
          continue;
        xd->above_txfm_context =
            cm->above_contexts.txfm[tile_info->tile_row] + mi_col + x_idx;
        xd->left_txfm_context =
            xd->left_txfm_context_buffer + ((mi_row + y_idx) & MAX_MIB_MASK);
        if (!pc_tree->split[i]->none) {
          pc_tree->split[i]->none =
              av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
          if (!pc_tree->split[i]->none)
            aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                               "Failed to allocate PICK_MODE_CONTEXT");
        } else {
          av1_reset_pmc(pc_tree->split[i]->none);
        }
        pc_tree->split[i]->partitioning = PARTITION_NONE;
        pick_sb_modes_nonrd(cpi, tile_data, x, mi_row + y_idx, mi_col + x_idx,
                            &block_rdc, subsize, pc_tree->split[i]->none);
        // TODO(yunqingwang): The rate here did not include the cost of
        // signaling PARTITION_NONE token in the sub-blocks.
        split_rdc.rate += block_rdc.rate;
        split_rdc.dist += block_rdc.dist;

        av1_rd_cost_update(x->rdmult, &split_rdc);

        if (none_rdc.rdcost < split_rdc.rdcost) {
          break;
        }

        if (i != SUB_PARTITIONS_SPLIT - 1)
          encode_b_nonrd(cpi, tile_data, td, tp, mi_row + y_idx, mi_col + x_idx,
                         1, subsize, PARTITION_NONE, pc_tree->split[i]->none,
                         NULL);
      }
      av1_restore_context(x, &x_ctx, mi_row, mi_col, bsize, num_planes);
      split_rdc.rdcost = RDCOST(x->rdmult, split_rdc.rate, split_rdc.dist);
    }
  }

  if (none_rdc.rdcost < split_rdc.rdcost) {
    /* Predicted samples can not be reused for PARTITION_NONE since same
     * buffer is being used to store the reconstructed samples of
     * PARTITION_SPLIT block. */
    if (do_split) x->reuse_inter_pred = false;

    mib[0]->bsize = bsize;
    pc_tree->partitioning = PARTITION_NONE;
    encode_b_nonrd(cpi, tile_data, td, tp, mi_row, mi_col, 0, bsize, partition,
                   pc_tree->none, NULL);
  } else {
    mib[0]->bsize = subsize;
    pc_tree->partitioning = PARTITION_SPLIT;
    /* Predicted samples can not be reused for PARTITION_SPLIT since same
     * buffer is being used to write the reconstructed samples. */
    // TODO(Cherma): Store and reuse predicted samples generated by
    // encode_b_nonrd() in DRY_RUN_NORMAL mode.
    x->reuse_inter_pred = false;

    for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
      int x_idx = (i & 1) * hbs;
      int y_idx = (i >> 1) * hbs;
      if ((mi_row + y_idx >= mi_params->mi_rows) ||
          (mi_col + x_idx >= mi_params->mi_cols))
        continue;

      // Note: We don't reset pc_tree->split[i]->none here because it
      // could contain results from the additional check. Instead, it is
      // reset before we enter the nonrd_check_partition_merge_mode
      // condition.
      if (!pc_tree->split[i]->none) {
        pc_tree->split[i]->none =
            av1_alloc_pmc(cpi, subsize, &td->shared_coeff_buf);
        if (!pc_tree->split[i]->none)
          aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                             "Failed to allocate PICK_MODE_CONTEXT");
      }
      encode_b_nonrd(cpi, tile_data, td, tp, mi_row + y_idx, mi_col + x_idx, 0,
                     subsize, PARTITION_NONE, pc_tree->split[i]->none, NULL);
    }
  }
}